

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O3

void __thiscall QDebug::putTimeUnit(QDebug *this,qint64 num,qint64 den)

{
  Stream *this_00;
  undefined1 uVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  qsizetype size;
  char *pcVar5;
  char *__s;
  long in_FS_OFFSET;
  bool bVar6;
  QByteArray local_90;
  QString local_78;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined2 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->stream;
  if (den < 2 || num != 1) {
    bVar6 = den == 1;
    if (bVar6 && 1 < num) {
      if (((ulong)(num * -0x46cd7c7d7051b5fd) >> 3 | num * -0x46cd7c7d7051b5fd << 0x3d) <
          0x881a22eee6) {
        num = (ulong)num / 0x1e18558;
        __s = "yr";
      }
      else if (((ulong)(num * 0x2554776998bbaddd) >> 7 | num * 0x2554776998bbaddd << 0x39) <
               0x1bbd779334f0) {
        num = (ulong)num / 0x93a80;
        __s = "wk";
      }
      else if (((ulong)(num * 0x54f43e32d21c10b) >> 7 | num * 0x54f43e32d21c10b << 0x39) <
               0xc22e4506728a) {
        num = (ulong)num / 0x15180;
        __s = "d";
      }
      else if (((ulong)(num * 0xfedcba987654321) >> 4 | num * 0xfedcba987654321 << 0x3c) <
               0x123456789abce0) {
        num = (ulong)num / 0xe10;
        __s = "h";
      }
      else {
        bVar6 = true;
        if (0x444444444444444 <
            ((ulong)(num * -0x1111111111111111) >> 2 | num * -0x1111111111111111 << 0x3e)) {
          __s = "s";
          goto LAB_00222cba;
        }
        num = (ulong)num / 0x3c;
        __s = "min";
      }
      bVar6 = true;
    }
    else {
      __s = "s";
    }
    if (!bVar6 || num != 1) goto LAB_00222cba;
    size = -1;
  }
  else {
    num = 1;
    __s = "s";
    bVar6 = false;
    if (den < 1000000000) {
      if (den < 1000) {
        if (den == 10) {
          uVar1 = 100;
        }
        else {
          bVar6 = false;
          if (den != 100) {
LAB_00222cba:
            if ((den < 1) || (num < 1)) {
              QString::asprintf((char **)&local_78,"<invalid time unit %lld/%lld>",num,den);
              QString::toLatin1_helper_inplace(&local_90,&local_78);
              putTimeUnit((QDebug *)&local_78);
              goto LAB_00222e0f;
            }
            pcVar5 = (char *)((long)&local_78.d.d + 1);
            local_78.d.d._4_4_ = 0xaaaaaaaa;
            local_78.d.ptr._0_4_ = 0xaaaaaaaa;
            local_78.d.ptr._4_4_ = 0xaaaaaaaa;
            local_58 = 0xaaaaaaaa;
            uStack_54 = 0xaaaaaaaa;
            uStack_50 = 0xaaaaaaaa;
            uStack_4c = 0xaaaaaaaa;
            local_78.d.size._0_4_ = 0xaaaaaaaa;
            local_78.d.size._4_4_ = 0xaaaaaaaa;
            uStack_60 = 0xaaaaaaaa;
            uStack_5c = 0xaaaaaaaa;
            local_48 = 0xaaaa;
            local_78.d.d._0_4_ = 0xaaaaaa5b;
            if (((ulong)num < 10000) || (num != ((ulong)num / 1000) * 1000)) {
              iVar2 = snprintf(pcVar5,0x31,"%lld");
            }
            else {
              iVar2 = snprintf(pcVar5,0x31,"%.6g",SUB84((double)num,0));
            }
            lVar4 = (long)iVar2;
            if (bVar6) {
              lVar4 = lVar4 + 1;
            }
            else {
              pcVar5 = (char *)((long)&local_78.d.d + lVar4 + 2);
              *(undefined1 *)((long)&local_78.d.d + lVar4 + 1) = 0x2f;
              if (((ulong)den < 10000) || ((ulong)den % 1000 != 0)) {
                iVar2 = snprintf(pcVar5,0x30U - lVar4,"%lld",den);
              }
              else {
                iVar2 = snprintf(pcVar5,0x30U - lVar4,"%.6g",SUB84((double)den,0));
              }
              lVar4 = lVar4 + 2 + (long)iVar2;
            }
            *(undefined1 *)((long)&local_78.d.d + lVar4) = 0x5d;
            sVar3 = strlen(__s);
            memcpy((void *)((long)&local_78.d.d + lVar4 + 1),__s,sVar3);
            sVar3 = strlen(__s);
            size = sVar3 + lVar4 + 1;
            __s = (char *)&local_78;
            goto LAB_00222e0a;
          }
          uVar1 = 99;
        }
      }
      else {
        uVar1 = 0x6d;
        if (den != 1000) {
          if (den != 1000000) goto LAB_00222cba;
          uVar1 = 0x75;
        }
      }
    }
    else if (den < 1000000000000000) {
      if (den == 1000000000) {
        uVar1 = 0x6e;
      }
      else {
        if (den != 1000000000000) goto LAB_00222cba;
        uVar1 = 0x70;
      }
    }
    else if (den == 1000000000000000) {
      uVar1 = 0x66;
    }
    else {
      if (den != 1000000000000000000) goto LAB_00222cba;
      uVar1 = 0x61;
    }
    __s = (char *)&local_78;
    local_78.d.d._0_3_ = CONCAT21(0x73,uVar1);
    size = 2;
  }
LAB_00222e0a:
  QByteArray::QByteArray(&local_90,__s,size);
LAB_00222e0f:
  ::QTextStream::operator<<(&this_00->ts,&local_90);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDebug::putTimeUnit(qint64 num, qint64 den)
{
    stream->ts << timeUnit(num, den); // ### optimize
}